

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiskin.cpp
# Opt level: O0

void setupBsp(BSP<int> *tAlg,uint n,uint p,int seed,IntVector *input,
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *bspInputs,
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *bspOutputs)

{
  value_type vVar1;
  reference pvVar2;
  element_type *this;
  int in_ECX;
  uint in_EDX;
  uint in_ESI;
  BSP<int> *in_RDI;
  vector<int,_std::allocator<int>_> *in_R8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_R9;
  uint i_3;
  SuperstepPointer s2;
  uint i_2;
  SuperstepPointer s1;
  uint i_1;
  SuperstepPointer s0;
  UTimer superstepCreator;
  uint j;
  value_type *vI;
  uint i;
  uint actInputLen;
  UTimer bspInputVectors;
  UTimer randomVector;
  random_device randomDevice;
  Superstep<int> *in_stack_ffffffffffffe808;
  BSP<int> *in_stack_ffffffffffffe810;
  string *in_stack_ffffffffffffe818;
  UTimer *in_stack_ffffffffffffe820;
  size_type in_stack_ffffffffffffe828;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffe830;
  random_device *in_stack_ffffffffffffe850;
  Superstep<int> *in_stack_ffffffffffffe860;
  function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>
  *in_stack_ffffffffffffe870;
  BSP<int> *protocol;
  ActivityFunction *in_stack_ffffffffffffe878;
  ActivityFunction *fun;
  element_type *in_stack_ffffffffffffe880;
  UTimer *in_stack_ffffffffffffe8a0;
  UTimer *this_00;
  uint local_167c;
  undefined1 local_1650 [196];
  uint local_158c;
  undefined1 local_1571 [93];
  uint local_1514;
  __native_type local_1510 [2];
  allocator local_1499;
  string local_1498 [95];
  allocator local_1439;
  string local_1438 [4068];
  int in_stack_fffffffffffffbac;
  IntVector *in_stack_fffffffffffffbb0;
  
  std::random_device::random_device(in_stack_ffffffffffffe850);
  std::allocator<int>::allocator((allocator<int> *)0x10506d);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffe830,in_stack_ffffffffffffe828,
             (allocator_type *)in_stack_ffffffffffffe820);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe820,
             (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe818);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe820);
  std::allocator<int>::~allocator((allocator<int> *)0x1050c3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1438,"Creating random vector",&local_1439);
  UTimer::UTimer(in_stack_ffffffffffffe820,in_stack_ffffffffffffe818);
  std::__cxx11::string::~string(local_1438);
  std::allocator<char>::~allocator((allocator<char> *)&local_1439);
  if (in_ECX == -1) {
    std::random_device::operator()((random_device *)0x10514e);
  }
  createRandomVector(in_stack_fffffffffffffbb0,in_stack_fffffffffffffbac);
  UTimer::~UTimer(in_stack_ffffffffffffe8a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1498,"Creating BSP input vectors",&local_1499);
  UTimer::UTimer(in_stack_ffffffffffffe820,in_stack_ffffffffffffe818);
  std::__cxx11::string::~string(local_1498);
  std::allocator<char>::~allocator((allocator<char> *)&local_1499);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x105220);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_ffffffffffffe830,in_stack_ffffffffffffe828,
           (allocator_type *)in_stack_ffffffffffffe820);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_ffffffffffffe820,
              (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_ffffffffffffe818);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_ffffffffffffe820);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x105276);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x10529a);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_ffffffffffffe830,in_stack_ffffffffffffe828,
           (allocator_type *)in_stack_ffffffffffffe820);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_ffffffffffffe820,
              (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)in_stack_ffffffffffffe818);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_ffffffffffffe820);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x1052e8);
  local_1510[1]._8_4_ = in_ESI / in_EDX;
  for (local_1510[1]._4_4_ = 0; (uint)local_1510[1]._4_4_ < in_EDX;
      local_1510[1]._4_4_ = local_1510[1]._4_4_ + 1) {
    std::allocator<int>::allocator((allocator<int> *)0x105342);
    std::vector<int,_std::allocator<int>_>::vector
              (in_stack_ffffffffffffe830,in_stack_ffffffffffffe828,
               (allocator_type *)in_stack_ffffffffffffe820);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[](in_R9,(ulong)(uint)local_1510[1]._4_4_);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe820,
               (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe818);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe820);
    std::allocator<int>::~allocator((allocator<int> *)0x1053a1);
    local_1510[0]._0_8_ =
         std::
         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ::operator[](in_R9,(ulong)(uint)local_1510[1]._4_4_);
    for (local_1514 = 0; local_1514 < (uint)local_1510[1]._8_4_; local_1514 = local_1514 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         (in_R8,(ulong)(local_1510[1]._8_4_ * local_1510[1]._4_4_ + local_1514));
      vVar1 = *pvVar2;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_1510[0]._0_8_,(ulong)local_1514
                         );
      *pvVar2 = vVar1;
    }
  }
  UTimer::~UTimer(in_stack_ffffffffffffe8a0);
  this_00 = (UTimer *)local_1571;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_1571 + 1),"Creating supersteps",(allocator *)this_00);
  UTimer::UTimer(in_stack_ffffffffffffe820,in_stack_ffffffffffffe818);
  std::__cxx11::string::~string((string *)(local_1571 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1571);
  operator_new(0x188);
  Superstep<int>::Superstep(in_stack_ffffffffffffe860);
  std::shared_ptr<Superstep<int>>::shared_ptr<Superstep<int>,void>
            ((shared_ptr<Superstep<int>_> *)in_stack_ffffffffffffe810,in_stack_ffffffffffffe808);
  for (local_158c = 0; local_158c < in_EDX; local_158c = local_158c + 1) {
    in_stack_ffffffffffffe880 =
         std::__shared_ptr_access<Superstep<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<Superstep<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )0x10567f);
    std::function<void(int,std::vector<int,std::allocator<int>>&)>::
    function<setupBsp(BSP<int>&,unsigned_int,unsigned_int,int,std::vector<int,std::allocator<int>>&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>&)::__0,void>
              ((function<void_(int,_std::vector<int,_std::allocator<int>_>_&)> *)
               in_stack_ffffffffffffe820,(anon_class_1_0_00000001 *)in_stack_ffffffffffffe818);
    std::
    function<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>(int,std::vector<int,std::allocator<int>>&)>
    ::
    function<setupBsp(BSP<int>&,unsigned_int,unsigned_int,int,std::vector<int,std::allocator<int>>&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>&)::__1,void>
              ((function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>
                *)in_stack_ffffffffffffe820,(anon_class_4_1_54a39810 *)in_stack_ffffffffffffe818);
    Superstep<int>::addActivity
              (in_stack_ffffffffffffe880,in_stack_ffffffffffffe878,in_stack_ffffffffffffe870);
    std::
    function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>
    ::~function((function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>
                 *)0x1056f5);
    std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>::~function
              ((function<void_(int,_std::vector<int,_std::allocator<int>_>_&)> *)0x105702);
  }
  fun = (ActivityFunction *)(local_1650 + 0x60);
  protocol = in_RDI;
  std::shared_ptr<Superstep<int>_>::shared_ptr
            ((shared_ptr<Superstep<int>_> *)in_stack_ffffffffffffe810,
             (shared_ptr<Superstep<int>_> *)in_stack_ffffffffffffe808);
  BSP<int>::addSuperstep(in_stack_ffffffffffffe810,(SuperstepPointer *)in_stack_ffffffffffffe808);
  std::shared_ptr<Superstep<int>_>::~shared_ptr((shared_ptr<Superstep<int>_> *)0x10582a);
  operator_new(0x188);
  Superstep<int>::Superstep(in_stack_ffffffffffffe860);
  std::shared_ptr<Superstep<int>>::shared_ptr<Superstep<int>,void>
            ((shared_ptr<Superstep<int>_> *)in_stack_ffffffffffffe810,in_stack_ffffffffffffe808);
  for (local_1650._76_4_ = 0; (uint)local_1650._76_4_ < in_EDX;
      local_1650._76_4_ = local_1650._76_4_ + 1) {
    std::__shared_ptr_access<Superstep<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Superstep<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x105887);
    std::function<void(int,std::vector<int,std::allocator<int>>&)>::
    function<setupBsp(BSP<int>&,unsigned_int,unsigned_int,int,std::vector<int,std::allocator<int>>&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>&)::__2,void>
              ((function<void_(int,_std::vector<int,_std::allocator<int>_>_&)> *)
               in_stack_ffffffffffffe820,(anon_class_1_0_00000001 *)in_stack_ffffffffffffe818);
    in_stack_ffffffffffffe860 = (Superstep<int> *)local_1650;
    std::
    function<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>(int,std::vector<int,std::allocator<int>>&)>
    ::
    function<setupBsp(BSP<int>&,unsigned_int,unsigned_int,int,std::vector<int,std::allocator<int>>&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>&)::__3,void>
              ((function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>
                *)in_stack_ffffffffffffe820,(anon_class_4_1_54a39810 *)in_stack_ffffffffffffe818);
    Superstep<int>::addActivity
              (in_stack_ffffffffffffe880,fun,
               (function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>
                *)protocol);
    std::
    function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>
    ::~function((function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>
                 *)0x1058f1);
    std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>::~function
              ((function<void_(int,_std::vector<int,_std::allocator<int>_>_&)> *)0x1058fe);
  }
  std::shared_ptr<Superstep<int>_>::shared_ptr
            ((shared_ptr<Superstep<int>_> *)in_stack_ffffffffffffe810,
             (shared_ptr<Superstep<int>_> *)in_stack_ffffffffffffe808);
  BSP<int>::addSuperstep(in_stack_ffffffffffffe810,(SuperstepPointer *)in_stack_ffffffffffffe808);
  std::shared_ptr<Superstep<int>_>::~shared_ptr((shared_ptr<Superstep<int>_> *)0x1059ee);
  operator_new(0x188);
  Superstep<int>::Superstep(in_stack_ffffffffffffe860);
  std::shared_ptr<Superstep<int>>::shared_ptr<Superstep<int>,void>
            ((shared_ptr<Superstep<int>_> *)in_stack_ffffffffffffe810,in_stack_ffffffffffffe808);
  for (local_167c = 0; local_167c < in_EDX; local_167c = local_167c + 1) {
    this = std::__shared_ptr_access<Superstep<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Superstep<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x105a4b);
    std::function<void(int,std::vector<int,std::allocator<int>>&)>::
    function<setupBsp(BSP<int>&,unsigned_int,unsigned_int,int,std::vector<int,std::allocator<int>>&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>&)::__4,void>
              ((function<void_(int,_std::vector<int,_std::allocator<int>_>_&)> *)this,
               (anon_class_1_0_00000001 *)in_stack_ffffffffffffe818);
    std::
    function<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>(int,std::vector<int,std::allocator<int>>&)>
    ::
    function<setupBsp(BSP<int>&,unsigned_int,unsigned_int,int,std::vector<int,std::allocator<int>>&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>&)::__5,void>
              ((function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>
                *)this,(anon_class_4_1_54a39810 *)in_stack_ffffffffffffe818);
    Superstep<int>::addActivity
              (in_stack_ffffffffffffe880,fun,
               (function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>
                *)protocol);
    std::
    function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>
    ::~function((function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>
                 *)0x105ab5);
    std::function<void_(int,_std::vector<int,_std::allocator<int>_>_&)>::~function
              ((function<void_(int,_std::vector<int,_std::allocator<int>_>_&)> *)0x105ac2);
  }
  std::shared_ptr<Superstep<int>_>::shared_ptr
            ((shared_ptr<Superstep<int>_> *)in_RDI,
             (shared_ptr<Superstep<int>_> *)in_stack_ffffffffffffe808);
  BSP<int>::addSuperstep(in_RDI,(SuperstepPointer *)in_stack_ffffffffffffe808);
  std::shared_ptr<Superstep<int>_>::~shared_ptr((shared_ptr<Superstep<int>_> *)0x105bb2);
  std::shared_ptr<Superstep<int>_>::~shared_ptr((shared_ptr<Superstep<int>_> *)0x105bbf);
  std::shared_ptr<Superstep<int>_>::~shared_ptr((shared_ptr<Superstep<int>_> *)0x105bcc);
  std::shared_ptr<Superstep<int>_>::~shared_ptr((shared_ptr<Superstep<int>_> *)0x105bd9);
  UTimer::~UTimer(this_00);
  std::random_device::~random_device((random_device *)0x105bf3);
  return;
}

Assistant:

void setupBsp (BSP<int> &tAlg, uint n, uint p, int seed, IntVector &input,
				std::vector<IntVector> &bspInputs, std::vector<IntVector> &bspOutputs) {
	
	std::random_device randomDevice;
	input	= IntVector	(n);
	
	{
		UTimer randomVector ("Creating random vector");
		createRandomVector (input, (seed==-1) ? randomDevice() : seed);
	}


	{
		UTimer bspInputVectors ("Creating BSP input vectors");
		
		bspInputs	= std::vector<IntVector> (p);
		bspOutputs	= std::vector<IntVector> (p);

		uint actInputLen	= n/p;
		for (uint i=0; i<p; i++) {
			bspInputs[i]	= IntVector (actInputLen);
			auto &vI		= bspInputs[i];
			for (uint j=0; j<actInputLen; j++) {
				vI[j]	= input[(actInputLen*i)+j];
			}
		}
	}


	UTimer superstepCreator ("Creating supersteps");


	// ============================================================
	// ============================================================
	// Superstep 0

	BSP<int>::SuperstepPointer s0	= BSP<int>::SuperstepPointer (new Superstep<int> ());

	for (uint i= 0; i<p; i++) {
		s0->addActivity (
			[] (uint activityIndex, IntVector &actInput) {
				TISKIN_PRINT_V ("Input vector of activity " << activityIndex << ": ", actInput, "");
				std::sort (actInput.begin(), actInput.end());
				mapMutex.lock ();
				s0VectorsMap[activityIndex]	= actInput;
				mapMutex.unlock ();
			},
			[p] (uint activityIndex, IntVector &elements) {
				IntCommunicationProtocols cp (p);
				cp[0]	= IntVector (p+1);
				findOutSeparators (std::ref(cp[0]), std::ref(elements), p+1);
				for (uint i=1; i<p; i++) {
					cp[i]	= IntVector (p+1);
					cp[i]	= cp[0];
				}
				return cp;
			}
		);
	}

	tAlg.addSuperstep (std::move(s0));


	// ============================================================
	// ============================================================
	// Superstep 1 

	BSP<int>::SuperstepPointer s1	= BSP<int>::SuperstepPointer (new Superstep<int> ());

	for (uint i= 0; i<p; i++) {
		s1->addActivity (
			[] (uint activityIndex, IntVector &actInput) {
				TISKIN_PRINT_V ("Input vector of activity " << activityIndex << ": ", actInput, "");
				std::sort (actInput.begin(), actInput.end());
			},
			([p] (uint activityIndex, IntVector &commElements) {
				std::vector<IntVector> cp (p);
				IntVector separators (p+1);
				findOutSeparators (std::ref(separators), std::ref(commElements), p+1);
				
				mapMutex.lock ();
				IntVector &pi	= s0VectorsMap[activityIndex];
				mapMutex.unlock ();
				size_t i				= 0;	// Index for 'pi' vector
				size_t j				= 1;	// Index for 'separators' vector
				size_t k				= 0;	// Index for 'cp' vector

				while (i < pi.size()) {
					cp[k]	= IntVector ();
					while (i < pi.size() && pi[i] <= separators[j]) {
						cp[k].emplace_back (pi[i]);
						i++;
					}
					j++;
					k++;
				}

				return cp;
			})
		);
	}

	tAlg.addSuperstep (std::move(s1));


	// ============================================================
	// ============================================================
	// Superstep 2

	BSP<int>::SuperstepPointer s2	= BSP<int>::SuperstepPointer (new Superstep<int> ());

	for (uint i= 0; i<p; i++) {
		s2->addActivity (
			[] (uint activityIndex, IntVector &actInput) {
				TISKIN_PRINT_V ("Input vector of activity " << activityIndex << ": ", actInput, "");
				std::sort (actInput.begin(), actInput.end());
			},
			([p] (uint activityIndex, IntVector &elements) {
				std::vector<IntVector> cp (p);
				for (auto el: elements) {
					cp[activityIndex].emplace_back (el);
				}
				return cp;
			})
		);
	}

	tAlg.addSuperstep (std::move(s2));
}